

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O0

void __thiscall
ExchCXX::detail::LibxcKernelImpl::eval_exc_
          (LibxcKernelImpl *this,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
          host_buffer_type eps)

{
  undefined8 uVar1;
  bool bVar2;
  double *in_RCX;
  size_t in_RDX;
  undefined4 in_ESI;
  double *in_R8;
  string *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  string *in_stack_ffffffffffffff98;
  exchcxx_exception *in_stack_ffffffffffffffa0;
  LibxcKernelImpl *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  
  throw_if_uninitialized(in_stack_ffffffffffffffd0);
  bVar2 = XCKernelImpl::is_gga((XCKernelImpl *)0x25bf8a);
  if (!bVar2) {
    uVar1 = __cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    exchcxx_exception::exchcxx_exception
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
               in_stack_ffffffffffffff88);
    __cxa_throw(uVar1,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
  }
  xc_gga_exc((xc_func_type *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,in_RCX,in_R8,
             (double *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

GGA_EXC_GENERATOR( LibxcKernelImpl::eval_exc_ ) const {

  throw_if_uninitialized();
  EXCHCXX_BOOL_CHECK("KERNEL IS NOT GGA",  is_gga() );
  xc_gga_exc( &kernel_, N, rho, sigma, eps );

}